

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O1

void __thiscall
kj::anon_unknown_36::HttpInputStreamImpl::HttpInputStreamImpl
          (HttpInputStreamImpl *this,AsyncInputStream *inner,HttpHeaderTable *table)

{
  PromiseNode *in_RAX;
  char *pcVar1;
  
  (this->super_WrappableStreamMixin<kj::(anonymous_namespace)::HttpInputStreamImpl>).currentWrapper.
  ptr = (Maybe<kj::(anonymous_namespace)::HttpInputStreamImpl_&> *)0x0;
  (this->super_HttpInputStream)._vptr_HttpInputStream = (_func_int **)&PTR_readRequest_00702610;
  this->inner = inner;
  pcVar1 = (char *)kj::_::HeapArrayDisposer::allocateImpl
                             (1,0x1000,0x1000,(_func_void_void_ptr *)0x0,(_func_void_void_ptr *)0x0)
  ;
  (this->headerBuffer).ptr = pcVar1;
  (this->headerBuffer).size_ = 0x1000;
  (this->headerBuffer).disposer = (ArrayDisposer *)&kj::_::HeapArrayDisposer::instance;
  this->messageHeaderEnd = 0;
  (this->leftover).ptr = (char *)0x0;
  (this->leftover).size_ = 0;
  HttpHeaders::HttpHeaders(&this->headers,table);
  (this->resumingRequest).ptr.isSet = false;
  this->lineBreakBeforeNextHeader = false;
  this->broken = false;
  *(undefined8 *)&this->pendingMessageCount = 0;
  *(undefined8 *)((long)&(this->onMessageDone).ptr.disposer + 4) = 0;
  *(undefined4 *)((long)&(this->onMessageDone).ptr.ptr + 4) = 0;
  kj::_::readyNow();
  (this->messageReadQueue).super_PromiseBase.node.ptr = in_RAX;
  return;
}

Assistant:

explicit HttpInputStreamImpl(AsyncInputStream& inner, const HttpHeaderTable& table)
      : inner(inner), headerBuffer(kj::heapArray<char>(MIN_BUFFER)), headers(table) {
  }